

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

ArrayView<char> __thiscall
Corrade::Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
          (Containers *this,Array<char,_void_(*)(char_*,_unsigned_long)> *array,type values)

{
  size_t count;
  char *pcVar1;
  char *local_68;
  char *it;
  size_t relocateOffset;
  size_t valueCount;
  char *valueData;
  Array<char,_void_(*)(char_*,_unsigned_long)> *array_local;
  type values_local;
  
  values_local._data = values._data;
  array_local = array;
  local_68 = ArrayView<const_char>::data((ArrayView<const_char> *)&array_local);
  count = ArrayView<const_char>::size((ArrayView<const_char> *)&array_local);
  pcVar1 = Array<char,_void_(*)(char_*,_unsigned_long)>::data
                     ((Array<char,_void_(*)(char_*,_unsigned_long)> *)this);
  it = local_68 + -(long)pcVar1;
  pcVar1 = (char *)arrayCapacity<char,Corrade::Containers::ArrayMallocAllocator<char>>
                             ((Array<char,_void_(*)(char_*,_unsigned_long)> *)this);
  if (pcVar1 <= it) {
    it = (char *)0xffffffffffffffff;
  }
  pcVar1 = Implementation::arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>
                     ((Array<char,_void_(*)(char_*,_unsigned_long)> *)this,count);
  if (it != (char *)0xffffffffffffffff) {
    local_68 = Array<char,_void_(*)(char_*,_unsigned_long)>::data
                         ((Array<char,_void_(*)(char_*,_unsigned_long)> *)this);
    local_68 = local_68 + (long)it;
  }
  Implementation::arrayCopyConstruct<char,_0>(local_68,pcVar1,count);
  ArrayView<char>::ArrayView((ArrayView<char> *)&values_local._size,pcVar1,count);
  return stack0xffffffffffffffe8;
}

Assistant:

inline ArrayView<T> arrayAppend(Array<T>& array, const typename std::common_type<ArrayView<const T>>::type values) {
    /* Direct access & caching to speed up debug builds */
    const T* const valueData = values.data();
    const std::size_t valueCount = values.size();

    /* If the values are actually a slice of the original array, we need to
       relocate the view after growing because it may point to a stale location
       afterwards. If the offset is outside of the [0, capacity) range of the
       original array, we don't relocate. Similar check is in arrayInsert(),
       where it additionally has to adjust the offset based on whether the
       values are before or after the insertion point. */
    std::size_t relocateOffset = std::size_t(valueData - array.data());
    if(relocateOffset >= arrayCapacity<T, Allocator>(array))
        relocateOffset = ~std::size_t{};

    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, valueCount);
    Implementation::arrayCopyConstruct<T>(
        /* If values were a slice of the original array, relocate the view
           pointer relative to the (potentially reallocated) array. It may have
           pointed into the (potentially uninitialized) capacity, in which case
           we'll likely copy some garbage or we overwrite ourselves, but that's
           the user fault (and ASan would catch it). OTOH, if the capacity
           wouldn't be taken into account above, we may end up reading from
           freed memory, which is far worse. */
        relocateOffset != ~std::size_t{} ? array.data() + relocateOffset :
            valueData,
        it, valueCount);
    return {it, valueCount};
}